

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O3

void spell_call_lightning(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int idam;
  CHAR_DATA *ch_00;
  char *txt;
  AFFECT_DATA af;
  
  bVar1 = is_affected(ch,(int)gsn_call_lightning);
  if (bVar1) {
    txt = "You have not yet recovered from your prior casting.\n\r";
  }
  else {
    ch_00 = get_char_world(ch,target_name);
    if ((ch_00 != (CHAR_DATA *)0x0) && (ch->in_room->area == ch_00->in_room->area)) {
      bVar1 = is_npc(ch_00);
      if (!bVar1) {
        if (ch_00 == ch) {
          txt = "That\'s really not a good idea.\n\r";
        }
        else if (ch->in_room->area->sky < 3) {
          txt = "The weather is not suitable for calling lightning.\n\r";
        }
        else {
          if (((ch_00->in_room->room_flags[0] & 8) == 0) && (ch_00->in_room->sector_type != 7)) {
            bVar1 = is_safe(ch,ch_00);
            if (!bVar1) {
              act("You call forth a bolt of lightning upon $N\'s location!",ch,(void *)0x0,ch_00,3);
              act("A bolt of lightning streaks down from the clouds above!",ch,(void *)0x0,ch_00,2);
              init_affect(&af);
              af.where = 0;
              af.aftype = 7;
              af.level = (short)level;
              af.duration = 0x24;
              af.location = 0;
              af.modifier = 0;
              af.type = (short)sn;
              affect_to_char(ch,&af);
              do_myell(ch_00,"Argh, I\'ve been struck by lightning!",(CHAR_DATA *)0x0);
              dice(level,8);
              saves_spell(level,ch_00,6);
              idam = dice(level,8);
              damage_new(ch,ch_00,idam,sn,6,true,false,0,1,"The lightning strike*");
            }
            return;
          }
          txt = "Lightning cannot strike indoors.\n\r";
        }
        goto LAB_003105e2;
      }
    }
    txt = "Call lightning on whom?\n\r";
  }
LAB_003105e2:
  send_to_char(txt,ch);
  return;
}

Assistant:

void spell_call_lightning(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim;
	AFFECT_DATA af;
	int dam;

	if (is_affected(ch, gsn_call_lightning))
	{
		send_to_char("You have not yet recovered from your prior casting.\n\r", ch);
		return;
	}

	victim = get_char_world(ch, target_name);

	if (victim == nullptr || (ch->in_room->area != victim->in_room->area || is_npc(victim)))
	{
		send_to_char("Call lightning on whom?\n\r", ch);
		return;
	}

	if (victim == ch)
	{
		send_to_char("That's really not a good idea.\n\r", ch);
		return;
	}

	if (ch->in_room->area->sky < WeatherCondition::Drizzle)
	{
		send_to_char("The weather is not suitable for calling lightning.\n\r", ch);
		return;
	}

	if (IS_SET(victim->in_room->room_flags, ROOM_INDOORS) || victim->in_room->sector_type == SECT_INSIDE)
	{
		send_to_char("Lightning cannot strike indoors.\n\r", ch);
		return;
	}

	if (is_safe(ch, victim))
		return;

	act("You call forth a bolt of lightning upon $N's location!", ch, nullptr, victim, TO_CHAR);
	act("A bolt of lightning streaks down from the clouds above!", ch, nullptr, victim, TO_VICT);

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_TIMER;
	af.type = sn;
	af.level = level;
	af.duration = 36;
	af.location = 0;
	af.modifier = 0;
	affect_to_char(ch, &af);

	do_myell(victim, "Argh, I've been struck by lightning!", nullptr);

	dam = dice(level, 8);

	if (saves_spell(level, victim, DAM_LIGHTNING))
		dam /= 2;

	damage_new(ch, victim, dice(level, 8), sn, DAM_LIGHTNING, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "The lightning strike*");
}